

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O3

void av1_convert_model_to_params(double *params,WarpedMotionParams *model)

{
  long lVar1;
  TransformationType TVar2;
  double dVar3;
  double dVar4;
  uint uVar6;
  long lVar5;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  undefined8 local_58;
  
  dVar4 = params[1];
  dVar3 = floor(*params * 64.0 + 0.5);
  dVar4 = floor(dVar4 * 64.0 + 0.5);
  uVar8 = (uint)dVar3;
  uVar6 = -(uint)((int)dVar4 < 0x1000);
  uVar10 = ~-(uint)((int)uVar8 < 0x1000) & 0x1000 | uVar8 & -(uint)((int)uVar8 < 0x1000);
  uVar6 = ~uVar6 & 0x1000 | (int)dVar4 & uVar6;
  uVar9 = -(uint)(-0x1000 < (int)uVar10);
  uVar11 = -(uint)(-0x1000 < (int)uVar6);
  *(ulong *)model->wmmat =
       CONCAT44((~uVar11 & 0xfffff000 | uVar6 & uVar11) << 10,
                (~uVar9 & 0xfffff000 | uVar10 & uVar9) << 10);
  lVar5 = 2;
  lVar7 = 3;
  lVar1 = 0;
  do {
    local_68 = (int)lVar5;
    iStack_64 = (int)((ulong)lVar5 >> 0x20);
    iStack_60 = (int)lVar7;
    iStack_5c = (int)((ulong)lVar7 >> 0x20);
    local_58 = CONCAT44(-(uint)(iStack_5c == 0 && (iStack_60 == 5 || iStack_60 == 2)),
                        -(uint)(iStack_64 == 0 && (local_68 == 5 || local_68 == 2))) &
               0x800000008000;
    dVar4 = (params + lVar1 + 2)[1];
    dVar3 = floor(params[lVar1 + 2] * 32768.0 + 0.5);
    dVar4 = floor(dVar4 * 32768.0 + 0.5);
    uVar10 = -(uint)((int)dVar3 - (int)local_58 < 0x1000);
    uVar6 = -(uint)((int)dVar4 - local_58._4_4_ < 0x1000);
    uVar9 = ~uVar10 & 0x1000 | (int)dVar3 - (int)local_58 & uVar10;
    uVar11 = ~uVar6 & 0x1000 | (int)dVar4 - local_58._4_4_ & uVar6;
    uVar10 = -(uint)(-0x1000 < (int)uVar9);
    uVar6 = -(uint)(-0x1000 < (int)uVar11);
    *(ulong *)(model->wmmat + lVar1 + 2) =
         CONCAT44(((~uVar6 & 0xfffff000 | uVar11 & uVar6) + local_58._4_4_) * 2,
                  ((~uVar10 & 0xfffff000 | uVar9 & uVar10) + (int)local_58) * 2);
    lVar1 = lVar1 + 2;
    lVar5 = lVar5 + 2;
    lVar7 = lVar7 + 2;
  } while (lVar1 != 4);
  if ((((model->wmmat[5] == 0x10000) && (model->wmmat[4] == 0)) && (model->wmmat[2] == 0x10000)) &&
     (model->wmmat[3] == 0)) {
    TVar2 = '\x01';
    if (model->wmmat[1] == 0) {
      TVar2 = uVar8 != 0;
    }
  }
  else if ((model->wmmat[2] != model->wmmat[5]) ||
          (TVar2 = '\x02', model->wmmat[3] + model->wmmat[4] != 0)) {
    TVar2 = '\x03';
  }
  model->wmtype = TVar2;
  model->invalid = '\0';
  return;
}

Assistant:

void av1_convert_model_to_params(const double *params,
                                 WarpedMotionParams *model) {
  convert_to_params(params, model->wmmat);
  model->wmtype = get_wmtype(model);
  model->invalid = 0;
}